

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

int lws_tls_restrict_borrow(lws_context *context)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = context->simultaneous_ssl_restriction;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar1 = context->simultaneous_ssl;
    if ((int)uVar1 < iVar2) {
      iVar3 = uVar1 + 1;
      context->simultaneous_ssl = iVar3;
      if (iVar3 == iVar2) {
        lws_gate_accepts(context,0);
        iVar3 = context->simultaneous_ssl;
      }
      iVar2 = 0;
      _lws_log(8,"%s: %d -> %d\n","lws_tls_restrict_borrow",(ulong)(iVar3 - 1));
    }
    else {
      _lws_log(4,"%s: tls connection limit %d\n","lws_tls_restrict_borrow",(ulong)uVar1);
      iVar2 = 1;
    }
  }
  return iVar2;
}

Assistant:

int
lws_tls_restrict_borrow(struct lws_context *context)
{
	if (!context->simultaneous_ssl_restriction)
		return 0;

	if (context->simultaneous_ssl >= context->simultaneous_ssl_restriction) {
		lwsl_notice("%s: tls connection limit %d\n", __func__,
			    context->simultaneous_ssl);
		return 1;
	}

	if (++context->simultaneous_ssl == context->simultaneous_ssl_restriction)
		/* that was the last allowed SSL connection */
		lws_gate_accepts(context, 0);

	lwsl_info("%s: %d -> %d\n", __func__,
		  context->simultaneous_ssl - 1,
		  context->simultaneous_ssl);

	return 0;
}